

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_client_connection.c
# Opt level: O2

apx_error_t
apx_clientSocketConnection_create(apx_clientSocketConnection_t *self,msocket_t *socket_object)

{
  apx_error_t aVar1;
  apx_connectionBaseVTable_t base_connection_vtable;
  apx_connectionInterface_t connection_interface;
  
  if (self == (apx_clientSocketConnection_t *)0x0) {
    aVar1 = 1;
  }
  else {
    pthread_mutex_init((pthread_mutex_t *)&self->lock,(pthread_mutexattr_t *)0x0);
    self->default_buffer_size = 0x1000;
    self->pending_bytes = 0;
    apx_connectionBaseVTable_create
              (&base_connection_vtable,apx_clientSocketConnection_vdestroy,
               apx_clientSocketConnection_vstart,apx_clientSocketConnection_vclose);
    connection_interface.remote_file_published_notification =
         (_func_apx_error_t_void_ptr_apx_file_t_ptr *)0x0;
    connection_interface.remote_file_write_notification =
         (_func_apx_error_t_void_ptr_apx_file_t_ptr_uint32_t_uint8_t_ptr_apx_size_t *)0x0;
    connection_interface.transmit_max_buffer_size =
         apx_clientSocketConnection_vtransmit_max_bytes_avaiable;
    connection_interface.transmit_current_bytes_avaiable =
         apx_clientSocketConnection_vtransmit_current_bytes_avaiable;
    connection_interface.transmit_begin = apx_clientSocketConnection_vtransmit_begin;
    connection_interface.transmit_end = apx_clientSocketConnection_vtransmit_end;
    connection_interface.transmit_data_message = apx_clientSocketConnection_vtransmit_data_message;
    connection_interface.transmit_direct_message =
         apx_clientSocketConnection_vtransmit_direct_message;
    connection_interface.arg = self;
    aVar1 = apx_clientConnection_create(&self->base,&base_connection_vtable,&connection_interface);
    if (aVar1 == 0) {
      adt_bytearray_create(&self->send_buffer,0x1000);
      register_msocket_handler(self,socket_object);
      apx_connectionBase_start((apx_connectionBase_t *)self);
    }
  }
  return aVar1;
}

Assistant:

apx_error_t apx_clientSocketConnection_create(apx_clientSocketConnection_t *self, SOCKET_TYPE * socket_object)
{
   if (self != 0)
   {
      apx_connectionBaseVTable_t base_connection_vtable;
      apx_connectionInterface_t connection_interface;
      MUTEX_INIT(self->lock);
      self->default_buffer_size = SEND_BUFFER_GROW_SIZE;
      self->pending_bytes = 0u;
      apx_connectionBaseVTable_create(&base_connection_vtable,
            apx_clientSocketConnection_vdestroy,
            apx_clientSocketConnection_vstart,
            apx_clientSocketConnection_vclose);
      create_connection_interface_vtable(self, &connection_interface);
      apx_error_t result = apx_clientConnection_create(&self->base, &base_connection_vtable, &connection_interface);
      if (result != APX_NO_ERROR)
      {
         return result;
      }
      adt_bytearray_create(&self->send_buffer, SEND_BUFFER_GROW_SIZE);
      register_msocket_handler(self, socket_object);
      apx_connectionBase_start(&self->base.base);///TODO: Don't call start from the constructor
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}